

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * __thiscall
flatbuffers::(anonymous_namespace)::TokenToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int t)

{
  char *__s;
  allocator<char> local_25 [16];
  undefined1 local_15;
  int local_14;
  string *psStack_10;
  int t_local;
  string *s;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 < 0x100) {
    local_15 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  else {
    __s = anon_unknown_0::TokenToString::tokens[local_14 + -0x100];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_25);
    std::allocator<char>::~allocator(local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string TokenToString(int t) {
  static const char * const tokens[] = {
    #define FLATBUFFERS_TOKEN(NAME, VALUE, STRING) STRING,
      FLATBUFFERS_GEN_TOKENS(FLATBUFFERS_TOKEN)
    #undef FLATBUFFERS_TOKEN
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, ...) \
      IDLTYPE,
      FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
  };
  if (t < 256) {  // A single ascii char token.
    std::string s;
    s.append(1, static_cast<char>(t));
    return s;
  } else {       // Other tokens.
    return tokens[t - 256];
  }
}